

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_ntlm_core.c
# Opt level: O3

CURLcode Curl_hmac_md5(uchar *key,uint keylen,uchar *data,uint datalen,uchar *output)

{
  CURLcode CVar1;
  HMAC_context *ctxt;
  
  ctxt = Curl_HMAC_init(Curl_HMAC_MD5,key,keylen);
  if (ctxt == (HMAC_context *)0x0) {
    CVar1 = CURLE_OUT_OF_MEMORY;
  }
  else {
    Curl_HMAC_update(ctxt,data,datalen);
    Curl_HMAC_final(ctxt,output);
    CVar1 = CURLE_OK;
  }
  return CVar1;
}

Assistant:

CURLcode Curl_hmac_md5(const unsigned char *key, unsigned int keylen,
                       const unsigned char *data, unsigned int datalen,
                       unsigned char *output)
{
  HMAC_context *ctxt = Curl_HMAC_init(Curl_HMAC_MD5, key, keylen);

  if(!ctxt)
    return CURLE_OUT_OF_MEMORY;

  /* Update the digest with the given challenge */
  Curl_HMAC_update(ctxt, data, datalen);

  /* Finalise the digest */
  Curl_HMAC_final(ctxt, output);

  return CURLE_OK;
}